

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash_dictionary_handler.c
# Opt level: O2

void test_open_address_dictionary_predicate_range_unsigned(planck_unit_test_t *tc)

{
  ion_boolean_t iVar1;
  planck_unit_result_t pVar2;
  undefined4 *key;
  ion_dict_cursor_t cursor;
  ion_record_info_t record;
  ion_dictionary_t test_dictionary;
  ion_predicate_t predicate;
  ion_dictionary_handler_t map_handler;
  
  key = (undefined4 *)malloc(4);
  record.key_size = 4;
  record.value_size = 10;
  createTestDictionary(&map_handler,&record,10,&test_dictionary,key_type_numeric_unsigned);
  cursor.destroy = oadict_destroy_cursor;
  dictionary_build_predicate(&predicate,'\x01');
  *key = 0;
  cursor.dictionary = &test_dictionary;
  cursor.predicate = &predicate;
  iVar1 = test_predicate(&cursor,key);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(iVar1 == '\x01'),0x1bb,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 != '\0') {
    *key = 1;
    iVar1 = test_predicate(&cursor,key);
    pVar2 = planck_unit_assert_true
                      (tc,(uint)(iVar1 == '\x01'),0x1bf,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                       ,"condition was false, expected true");
    if (pVar2 != '\0') {
      *key = 2;
      iVar1 = test_predicate(&cursor,key);
      pVar2 = planck_unit_assert_true
                        (tc,(uint)(iVar1 == '\x01'),0x1c3,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                         ,"condition was false, expected true");
      if (pVar2 != '\0') {
        *key = 3;
        iVar1 = test_predicate(&cursor,key);
        pVar2 = planck_unit_assert_true
                          (tc,(uint)(iVar1 == '\0'),0x1c7,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                           ,"condition was false, expected true");
        if (pVar2 != '\0') {
          *key = 4;
          iVar1 = test_predicate(&cursor,key);
          pVar2 = planck_unit_assert_true
                            (tc,(uint)(iVar1 == '\0'),0x1cb,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                             ,"condition was false, expected true");
          if (pVar2 != '\0') {
            free(key);
            (*(test_dictionary.handler)->delete_dictionary)(&test_dictionary);
            return;
          }
        }
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_dictionary_predicate_range_unsigned(
	planck_unit_test_t *tc
) {
	ion_key_t key_under_test;

	key_under_test = malloc(sizeof(unsigned int));

	int					size;
	ion_record_info_t	record;

	/* this is required for initializing the hash map and should come from the dictionary */
	record.key_size		= sizeof(int);
	record.value_size	= 10;
	size				= 10;

	ion_dictionary_handler_t	map_handler;			/* create handler for hashmap */
	ion_dictionary_t			test_dictionary;		/* dictionary handler for test instance */

	createTestDictionary(&map_handler, &record, size, &test_dictionary, key_type_numeric_unsigned);

	ion_dict_cursor_t cursor;	/* create a new cursor */

	cursor.destroy = oadict_destroy_cursor;

	/* create a new predicate statement */
	ion_predicate_t predicate;

	dictionary_build_predicate(&predicate, predicate_range, IONIZE(0, int), IONIZE(2, int));

	cursor.dictionary	= &test_dictionary;					/* register test dictionary */
	cursor.predicate	= &predicate;						/* register predicate */

	memcpy(key_under_test, &(unsigned int) { 0 }, sizeof(unsigned int));

	/* printf("key %i\n",*(unsigned int *)key_under_test); */

	PLANCK_UNIT_ASSERT_TRUE(tc, boolean_true == test_predicate(&cursor, key_under_test));

	memcpy(key_under_test, &(unsigned int) { 1 }, sizeof(unsigned int));

	PLANCK_UNIT_ASSERT_TRUE(tc, boolean_true == test_predicate(&cursor, key_under_test));

	memcpy(key_under_test, &(unsigned int) { 2 }, sizeof(unsigned int));

	PLANCK_UNIT_ASSERT_TRUE(tc, boolean_true == test_predicate(&cursor, key_under_test));

	memcpy(key_under_test, &(unsigned int) { 3 }, sizeof(unsigned int));

	PLANCK_UNIT_ASSERT_TRUE(tc, boolean_false == test_predicate(&cursor, key_under_test));

	memcpy(key_under_test, &(unsigned int) { 4 }, sizeof(unsigned int));

	PLANCK_UNIT_ASSERT_TRUE(tc, boolean_false == test_predicate(&cursor, key_under_test));

	free(key_under_test);

	/* destroy cursor for cleanup */
	/* cursor->destroy(&cursor); */
	/* and destroy the dictionary instance */
	test_dictionary.handler->delete_dictionary(&test_dictionary);
}